

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O2

void ImGui_ImplGlfwGL3_InvalidateDeviceObjects(void)

{
  if (g_VaoHandle != 0) {
    (*glad_glDeleteVertexArrays)(1,&g_VaoHandle);
  }
  if (g_VboHandle != 0) {
    (*glad_glDeleteBuffers)(1,&g_VboHandle);
  }
  if (g_ElementsHandle != 0) {
    (*glad_glDeleteBuffers)(1,&g_ElementsHandle);
  }
  g_ElementsHandle = 0;
  g_VboHandle = 0;
  g_VaoHandle = 0;
  (*glad_glDetachShader)(g_ShaderHandle,g_VertHandle);
  (*glad_glDeleteShader)(g_VertHandle);
  g_VertHandle = 0;
  (*glad_glDetachShader)(g_ShaderHandle,g_FragHandle);
  (*glad_glDeleteShader)(g_FragHandle);
  g_FragHandle = 0;
  (*glad_glDeleteProgram)(g_ShaderHandle);
  g_ShaderHandle = 0;
  if (g_FontTexture != 0) {
    (*glad_glDeleteTextures)(1,&g_FontTexture);
    ((GImGui->IO).Fonts)->TexID = (void *)0x0;
    g_FontTexture = 0;
  }
  return;
}

Assistant:

void    ImGui_ImplGlfwGL3_InvalidateDeviceObjects()
{
    if (g_VaoHandle) glDeleteVertexArrays(1, &g_VaoHandle);
    if (g_VboHandle) glDeleteBuffers(1, &g_VboHandle);
    if (g_ElementsHandle) glDeleteBuffers(1, &g_ElementsHandle);
    g_VaoHandle = g_VboHandle = g_ElementsHandle = 0;

    glDetachShader(g_ShaderHandle, g_VertHandle);
    glDeleteShader(g_VertHandle);
    g_VertHandle = 0;

    glDetachShader(g_ShaderHandle, g_FragHandle);
    glDeleteShader(g_FragHandle);
    g_FragHandle = 0;

    glDeleteProgram(g_ShaderHandle);
    g_ShaderHandle = 0;

    if (g_FontTexture)
    {
        glDeleteTextures(1, &g_FontTexture);
        ImGui::GetIO().Fonts->TexID = 0;
        g_FontTexture = 0;
    }
}